

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2.cpp
# Opt level: O0

uint32 rw::ps2::getBatchSize(MatPipeline *pipe,uint32 vertCount)

{
  PipeAttribute *pPVar1;
  uint32 uVar2;
  uint local_30;
  uint32 local_2c;
  uint i;
  uint32 size;
  PipeAttribute *a;
  uint32 vertCount_local;
  MatPipeline *pipe_local;
  
  if (vertCount == 0) {
    pipe_local._4_4_ = 0;
  }
  else {
    local_2c = 1;
    for (local_30 = 0; local_30 < 10; local_30 = local_30 + 1) {
      pPVar1 = pipe->attribs[local_30];
      if ((pPVar1 != (PipeAttribute *)0x0) && ((pPVar1->attrib & 6) == 0)) {
        uVar2 = attribSize(pPVar1->attrib);
        local_2c = (vertCount * uVar2 + 0xf >> 4) + local_2c + 1;
      }
    }
    pipe_local._4_4_ = local_2c;
  }
  return pipe_local._4_4_;
}

Assistant:

static uint32
getBatchSize(MatPipeline *pipe, uint32 vertCount)
{
	PipeAttribute *a;
	if(vertCount == 0)
		return 0;
	uint32 size = 1;	// ITOP &c. at the end
	for(uint i = 0; i < nelem(pipe->attribs); i++)
		if((a = pipe->attribs[i]) && (a->attrib & AT_RW) == 0){
			size++;	// UNPACK &c.
			size += QWC(vertCount*attribSize(a->attrib));
		}
	return size;
}